

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDA.hpp
# Opt level: O0

void __thiscall
PCCompatible::MDA::CRTCOutputter::perform_bus_cycle_phase1(CRTCOutputter *this,BusState *state)

{
  OutputState OVar1;
  uint uVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  bool bVar5;
  byte local_4a;
  byte local_49;
  byte local_48;
  byte local_47;
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  OutputState local_34;
  byte local_21;
  byte local_20;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  OutputState OStack_1c;
  uint8_t blank;
  uint8_t intensity;
  uint8_t row;
  uint8_t glyph;
  uint8_t attributes;
  OutputState new_state;
  BusState *state_local;
  CRTCOutputter *this_local;
  
  if ((state->hsync & 1U) == 0 && (state->vsync & 1U) == 0) {
    bVar5 = false;
    if ((state->display_enable & 1U) != 0) {
      bVar5 = (this->control_ & 8) != 0;
    }
    local_34 = Border;
    if (bVar5) {
      local_34 = Pixels;
    }
  }
  else {
    local_34 = Sync;
  }
  OStack_1c = local_34;
  _intensity = state;
  state_local = (BusState *)this;
  if ((local_34 != this->output_state) || (0x372 < this->count)) {
    if (this->count != 0) {
      OVar1 = this->output_state;
      if (OVar1 == Sync) {
        Outputs::CRT::CRT::output_sync(&this->crt,this->count);
      }
      else if (OVar1 == Pixels) {
        Outputs::CRT::CRT::output_data(&this->crt,this->count);
        this->pixel_pointer = (uint8_t *)0x0;
        this->pixels = (uint8_t *)0x0;
      }
      else if (OVar1 == Border) {
        Outputs::CRT::CRT::output_blank(&this->crt,this->count);
      }
    }
    this->output_state = OStack_1c;
    this->count = 0;
  }
  if (this->output_state != Pixels) goto LAB_007d6142;
  if (this->pixels == (uint8_t *)0x0) {
    puVar3 = Outputs::CRT::CRT::begin_data(&this->crt,0x2d0,1);
    this->pixels = puVar3;
    this->pixel_pointer = puVar3;
    if ((this->pixels != (uint8_t *)0x0) && (this->count != 0)) {
      Outputs::CRT::CRT::output_blank(&this->crt,this->count);
      this->count = 0;
    }
  }
  if (this->pixels == (uint8_t *)0x0) goto LAB_007d6142;
  if ((_intensity->cursor & 1U) == 0) {
    local_1d = this->ram[*(int *)&_intensity->refresh_address * 2 + 1U & 0xfff];
    uVar2._0_2_ = _intensity->refresh_address;
    uVar2._2_2_ = _intensity->row_address;
    local_1e = this->ram[(ulong)(uVar2 & 0x7ff) * 2];
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->font,
                        (ulong)((uint)local_1e * 0x10 + (uint)local_1e * -2 +
                               (uint)_intensity->row_address));
    local_1f = *pbVar4;
    local_20 = (char)((local_1d & 8) >> 3) << 2 | 9;
    local_21 = 0;
    if ((local_1d == 0) || (local_1d == 8)) {
LAB_007d5ed8:
      local_1f = 0;
    }
    else if ((local_1d == 0x70) || (local_1d == 0x78)) {
LAB_007d5ede:
      local_1f = local_1f ^ 0xff;
      local_21 = local_20;
    }
    else {
      if ((local_1d == 0x80) || (local_1d == 0x88)) goto LAB_007d5ed8;
      if ((local_1d == 0xf0) || (local_1d == 0xf8)) goto LAB_007d5ede;
    }
    if ((((this->control_ & 0x20) != 0) && ((local_1d & 0x80) != 0)) &&
       ((_intensity->field_count & 0x10U) != 0)) {
      local_1f = local_1f ^ 0xff;
      local_41 = local_20;
      if (local_21 != 0) {
        local_41 = 0;
      }
      local_21 = local_41;
    }
    if (((local_1d & 7) == 1) && (_intensity->row_address == 0xd)) {
      std::fill<unsigned_char*,unsigned_char>(this->pixel_pointer,this->pixel_pointer + 9,&local_20)
      ;
    }
    else {
      local_42 = local_20;
      if ((local_1f & 0x80) == 0) {
        local_42 = 0;
      }
      *this->pixel_pointer = local_42;
      local_43 = local_20;
      if ((local_1f & 0x40) == 0) {
        local_43 = 0;
      }
      this->pixel_pointer[1] = local_43;
      local_44 = local_20;
      if ((local_1f & 0x20) == 0) {
        local_44 = 0;
      }
      this->pixel_pointer[2] = local_44;
      local_45 = local_20;
      if ((local_1f & 0x10) == 0) {
        local_45 = 0;
      }
      this->pixel_pointer[3] = local_45;
      local_46 = local_20;
      if ((local_1f & 8) == 0) {
        local_46 = 0;
      }
      this->pixel_pointer[4] = local_46;
      local_47 = local_20;
      if ((local_1f & 4) == 0) {
        local_47 = 0;
      }
      this->pixel_pointer[5] = local_47;
      local_48 = local_20;
      if ((local_1f & 2) == 0) {
        local_48 = 0;
      }
      this->pixel_pointer[6] = local_48;
      local_49 = local_20;
      if ((local_1f & 1) == 0) {
        local_49 = 0;
      }
      this->pixel_pointer[7] = local_49;
      if ((local_1e < 0xc0) || (0xdf < local_1e)) {
        local_4a = local_21;
      }
      else {
        local_4a = this->pixel_pointer[7];
      }
      this->pixel_pointer[8] = local_4a;
    }
  }
  else {
    this->pixel_pointer[8] = '\t';
    this->pixel_pointer[7] = '\t';
    this->pixel_pointer[6] = '\t';
    this->pixel_pointer[5] = '\t';
    this->pixel_pointer[4] = '\t';
    this->pixel_pointer[3] = '\t';
    this->pixel_pointer[2] = '\t';
    this->pixel_pointer[1] = '\t';
    *this->pixel_pointer = '\t';
  }
  this->pixel_pointer = this->pixel_pointer + 9;
LAB_007d6142:
  this->count = this->count + 9;
  if ((this->output_state == Pixels) && (this->pixel_pointer == this->pixels + 0x2d0)) {
    Outputs::CRT::CRT::output_data(&this->crt,this->count);
    this->count = 0;
    this->pixel_pointer = (uint8_t *)0x0;
    this->pixels = (uint8_t *)0x0;
  }
  return;
}

Assistant:

void perform_bus_cycle_phase1(const Motorola::CRTC::BusState &state) {
				// Determine new output state.
				const OutputState new_state =
					(state.hsync | state.vsync) ? OutputState::Sync :
						((state.display_enable && control_&0x08) ? OutputState::Pixels : OutputState::Border);

				// Upon either a state change or just having accumulated too much local time...
				if(new_state != output_state || count > 882) {
					// (1) flush preexisting state.
					if(count) {
						switch(output_state) {
							case OutputState::Sync:		crt.output_sync(count);		break;
							case OutputState::Border: 	crt.output_blank(count);	break;
							case OutputState::Pixels:
								crt.output_data(count);
								pixels = pixel_pointer = nullptr;
							break;
						}
					}

					// (2) adopt new state.
					output_state = new_state;
					count = 0;
				}

				// Collect pixels if applicable.
				if(output_state == OutputState::Pixels) {
					if(!pixels) {
						pixel_pointer = pixels = crt.begin_data(DefaultAllocationSize);

						// Flush any period where pixels weren't recorded due to back pressure.
						if(pixels && count) {
							crt.output_blank(count);
							count = 0;
						}
					}

					if(pixels) {
						static constexpr uint8_t high_intensity = 0x0d;
						static constexpr uint8_t low_intensity = 0x09;
						static constexpr uint8_t off = 0x00;

						if(state.cursor) {
							pixel_pointer[0] =	pixel_pointer[1] =	pixel_pointer[2] =	pixel_pointer[3] =
							pixel_pointer[4] =	pixel_pointer[5] =	pixel_pointer[6] =	pixel_pointer[7] =
							pixel_pointer[8] =	low_intensity;
						} else {
							const uint8_t attributes = ram[((state.refresh_address << 1) + 1) & 0xfff];
							const uint8_t glyph = ram[((state.refresh_address << 1) + 0) & 0xfff];
							uint8_t row = font[(glyph * 14) + state.row_address];

							const uint8_t intensity = (attributes & 0x08) ? high_intensity : low_intensity;
							uint8_t blank = off;

							// Handle irregular attributes.
							// Cf. http://www.seasip.info/VintagePC/mda.html#memmap
							switch(attributes) {
								case 0x00:	case 0x08:	case 0x80:	case 0x88:
									row = 0;
								break;
								case 0x70:	case 0x78:	case 0xf0:	case 0xf8:
									row ^= 0xff;
									blank = intensity;
								break;
							}

							// Apply blink if enabled.
							if((control_ & 0x20) && (attributes & 0x80) && (state.field_count & 16)) {
								row ^= 0xff;
								blank = (blank == off) ? intensity : off;
							}

							if(((attributes & 7) == 1) && state.row_address == 13) {
								// Draw as underline.
								std::fill(pixel_pointer, pixel_pointer + 9, intensity);
							} else {
								// Draw according to ROM contents, possibly duplicating final column.
								pixel_pointer[0] = (row & 0x80) ? intensity : off;
								pixel_pointer[1] = (row & 0x40) ? intensity : off;
								pixel_pointer[2] = (row & 0x20) ? intensity : off;
								pixel_pointer[3] = (row & 0x10) ? intensity : off;
								pixel_pointer[4] = (row & 0x08) ? intensity : off;
								pixel_pointer[5] = (row & 0x04) ? intensity : off;
								pixel_pointer[6] = (row & 0x02) ? intensity : off;
								pixel_pointer[7] = (row & 0x01) ? intensity : off;
								pixel_pointer[8] = (glyph >= 0xc0 && glyph < 0xe0) ? pixel_pointer[7] : blank;
							}
						}
						pixel_pointer += 9;
					}
				}

				// Advance.
				count += 9;

				// Output pixel row prematurely if storage is exhausted.
				if(output_state == OutputState::Pixels && pixel_pointer == pixels + DefaultAllocationSize) {
					crt.output_data(count);
					count = 0;

					pixels = pixel_pointer = nullptr;
				}
			}